

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void band_nz_1d(float32 *v,uint32 d1,float32 band)

{
  float fVar1;
  ulong uVar2;
  float32 fVar3;
  
  if (d1 != 0) {
    uVar2 = 0;
    do {
      fVar1 = (float)v[uVar2];
      if (((fVar1 != 0.0) || (NAN(fVar1))) &&
         (((0.0 < fVar1 && (fVar3 = band, fVar1 < (float)band)) ||
          ((fVar1 < 0.0 && (fVar3 = (float32)-(float)band, -(float)band < fVar1)))))) {
        v[uVar2] = fVar3;
      }
      uVar2 = uVar2 + 1;
    } while (d1 != uVar2);
  }
  return;
}

Assistant:

void
band_nz_1d(float32 *v,
	   uint32 d1,
	   float32 band)
{
    uint32 i;

    for (i = 0; i < d1; i++) {
	if (v[i] != 0) {
	    if ((v[i] > 0) && (v[i] < band)) {
		v[i] = band;
	    }
	    else if ((v[i] < 0) && (v[i] > -band)) {
		v[i] = -band;
	    }
	}
    }
}